

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HToyIO.cpp
# Opt level: O3

int readToy_MIP_cpp(char *filename,int *m_p,int *n_p,int *maxmin,double *offset,double **A,
                   double **b,double **c,double **lb,double **ub,int **integerColumn)

{
  size_t __size;
  uint uVar1;
  double *pdVar2;
  long lVar3;
  byte *pbVar4;
  byte bVar5;
  int iVar6;
  FILE *__stream;
  double *pdVar7;
  int *piVar8;
  char *pcVar9;
  byte *pbVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  ulong __n;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  double dVar23;
  char buff [255];
  byte local_138 [264];
  
  printf("readMPS: Trying to open file %s\n",filename);
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    pcVar9 = "readInput: Not opened file OK";
LAB_001557ab:
    puts(pcVar9);
    return 1;
  }
  puts("readInput: Opened file  OK");
  fgets((char *)local_138,0xff,__stream);
  __isoc99_sscanf(local_138,"%d %d %d",m_p,n_p,maxmin);
  uVar1 = *n_p;
  lVar15 = (long)(int)uVar1;
  iVar6 = *m_p;
  uVar16 = (ulong)iVar6;
  __size = lVar15 * 8;
  pdVar7 = (double *)malloc(__size);
  *c = pdVar7;
  pdVar7 = (double *)malloc(uVar16 * lVar15 * 8);
  *A = pdVar7;
  pdVar7 = (double *)malloc(uVar16 * 8);
  *b = pdVar7;
  pdVar7 = (double *)malloc(__size);
  *lb = pdVar7;
  pdVar7 = (double *)malloc(__size);
  *ub = pdVar7;
  piVar8 = (int *)malloc(lVar15 * 4);
  *integerColumn = piVar8;
  fgets((char *)local_138,0xff,__stream);
  uVar22 = (ulong)uVar1;
  if (-1 < lVar15) {
    lVar20 = 0;
    lVar18 = 0;
    do {
      lVar11 = (long)(int)lVar18;
      lVar18 = lVar11 + -1;
      do {
        lVar12 = lVar18;
        lVar11 = lVar11 + 1;
        bVar5 = local_138[lVar12 + 1];
        lVar18 = lVar12 + 1;
      } while (bVar5 == 0x20);
      uVar14 = 0;
      while ((bVar5 & 0xdf) != 0) {
        lVar3 = uVar14 + lVar18;
        uVar14 = uVar14 + 1;
        lVar11 = lVar11 + 1;
        bVar5 = local_138[lVar3 + 1];
      }
      if ((int)uVar14 < 1) {
LAB_00155792:
        pcVar9 = "Error reading file: not enough numbers on row of objective.";
        goto LAB_001557ab;
      }
      pcVar9 = (char *)malloc(uVar14 & 0xffffffff);
      memcpy(pcVar9,local_138 + lVar12 + 1,uVar14);
      dVar23 = atof(pcVar9);
      if (lVar20 < lVar15) {
        (*c)[lVar20] = dVar23;
        lVar18 = lVar11;
        if ((local_138 + lVar12 + 1)[uVar14] == 0) goto LAB_00155792;
      }
      else {
        *offset = dVar23;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != uVar22 + 1);
  }
  uVar14 = 0;
  if (0 < iVar6) {
    uVar14 = uVar16;
  }
  if (0 < iVar6) {
    uVar17 = 0;
    do {
      fgets((char *)local_138,0xff,__stream);
      for (uVar21 = 0; local_138[uVar21] == 0x20; uVar21 = uVar21 + 1) {
      }
      if (local_138[uVar21] == 0) {
        printf("Error reading file: not enough numbers on row %d of A.\n",uVar17 & 0xffffffff);
      }
      if (0 < (int)uVar1) {
        uVar19 = 0;
        do {
          uVar13 = (uint)uVar21;
          lVar18 = (long)(int)uVar13 + -1;
          do {
            lVar20 = lVar18;
            uVar13 = uVar13 + 1;
            bVar5 = local_138[lVar20 + 1];
            lVar18 = lVar20 + 1;
          } while (bVar5 == 0x20);
          __n = 0;
          while (uVar21 = (ulong)uVar13, (bVar5 & 0xdf) != 0) {
            lVar18 = __n + lVar20 + 1;
            __n = __n + 1;
            uVar13 = uVar13 + 1;
            bVar5 = local_138[lVar18 + 1];
          }
          if ((int)__n < 1) {
            pcVar9 = "Error reading file: not enough numbers on row for RHS.";
            goto LAB_001557ab;
          }
          pcVar9 = (char *)malloc(__n & 0xffffffff);
          memcpy(pcVar9,local_138 + lVar20 + 1,__n);
          dVar23 = atof(pcVar9);
          (*A)[uVar19 * uVar16 + uVar17] = dVar23;
          if ((local_138 + lVar20 + 1)[__n] == 0) goto LAB_0015579b;
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar22);
      }
      lVar18 = (long)(int)uVar21 + -1;
      pbVar4 = local_138 + (long)(int)uVar21 + 1;
      do {
        pbVar10 = pbVar4;
        lVar20 = lVar18;
        bVar5 = local_138[lVar20 + 1];
        lVar18 = lVar20 + 1;
        pbVar4 = pbVar10 + 1;
      } while (bVar5 == 0x20);
      uVar21 = 0;
      while ((bVar5 & 0xdf) != 0) {
        uVar21 = uVar21 + 1;
        bVar5 = *pbVar10;
        pbVar10 = pbVar10 + 1;
      }
      if ((int)uVar21 < 1) {
LAB_0015579b:
        pcVar9 = "Error reading file: not enough numbers on constraint row.";
        goto LAB_001557ab;
      }
      pcVar9 = (char *)malloc(uVar21 & 0xffffffff);
      memcpy(pcVar9,local_138 + lVar20 + 1,uVar21);
      dVar23 = atof(pcVar9);
      (*b)[uVar17] = dVar23;
      uVar17 = uVar17 + 1;
    } while (uVar17 != (uVar14 & 0xffffffff));
  }
  if ((int)uVar1 < 1) {
    pcVar9 = fgets((char *)local_138,0xff,__stream);
    if (pcVar9 == (char *)0x0) goto LAB_00155974;
  }
  else {
    pdVar7 = *lb;
    pdVar2 = *ub;
    piVar8 = *integerColumn;
    uVar16 = 0;
    do {
      pdVar7[uVar16] = 0.0;
      pdVar2[uVar16] = 1e+200;
      piVar8[uVar16] = 0;
      uVar16 = uVar16 + 1;
    } while (uVar22 != uVar16);
    pcVar9 = fgets((char *)local_138,0xff,__stream);
    if (pcVar9 == (char *)0x0) goto LAB_00155974;
    if (0 < (int)uVar1) {
      uVar16 = 0;
      lVar18 = 0;
      do {
        lVar18 = (long)(int)lVar18;
        lVar20 = lVar18 + -1;
        do {
          lVar11 = lVar20;
          lVar18 = lVar18 + 1;
          bVar5 = local_138[lVar11 + 1];
          lVar20 = lVar11 + 1;
        } while (bVar5 == 0x20);
        uVar14 = 0;
        while ((bVar5 & 0xdf) != 0) {
          lVar20 = uVar14 + lVar11 + 1;
          uVar14 = uVar14 + 1;
          lVar18 = lVar18 + 1;
          bVar5 = local_138[lVar20 + 1];
        }
        if ((int)uVar14 < 1) {
          pcVar9 = "Comment reading file: no numbers on LB row.";
          goto LAB_0015598b;
        }
        pcVar9 = (char *)malloc(uVar14 & 0xffffffff);
        memcpy(pcVar9,local_138 + lVar11 + 1,uVar14);
        dVar23 = atof(pcVar9);
        (*lb)[uVar16] = dVar23;
        uVar16 = uVar16 + 1;
        if (((long)uVar16 < lVar15) && ((local_138 + lVar11 + 1)[uVar14] == 0)) {
          pcVar9 = "Error reading file: not enough numbers on LB row.";
          goto LAB_001557ab;
        }
      } while (uVar16 != uVar22);
    }
  }
  pcVar9 = fgets((char *)local_138,0xff,__stream);
  if (pcVar9 != (char *)0x0) {
    if ((int)uVar1 < 1) {
      fgets((char *)local_138,0xff,__stream);
    }
    else {
      uVar16 = 0;
      lVar18 = 0;
      do {
        lVar18 = (long)(int)lVar18;
        lVar20 = lVar18 + -1;
        do {
          lVar11 = lVar20;
          lVar18 = lVar18 + 1;
          bVar5 = local_138[lVar11 + 1];
          lVar20 = lVar11 + 1;
        } while (bVar5 == 0x20);
        uVar14 = 0;
        while ((bVar5 & 0xdf) != 0) {
          lVar20 = uVar14 + lVar11 + 1;
          uVar14 = uVar14 + 1;
          lVar18 = lVar18 + 1;
          bVar5 = local_138[lVar20 + 1];
        }
        if ((int)uVar14 < 1) {
          pcVar9 = "Comment reading file: no numbers on UB row.";
          goto LAB_0015598b;
        }
        pcVar9 = (char *)malloc(uVar14 & 0xffffffff);
        memcpy(pcVar9,local_138 + lVar11 + 1,uVar14);
        dVar23 = atof(pcVar9);
        (*ub)[uVar16] = dVar23;
        uVar16 = uVar16 + 1;
        if (((long)uVar16 < lVar15) && ((local_138 + lVar11 + 1)[uVar14] == 0)) {
          pcVar9 = "Error reading file: not enough numbers on UB row.";
          goto LAB_001557ab;
        }
      } while (uVar16 != uVar22);
      pcVar9 = fgets((char *)local_138,0xff,__stream);
      if ((pcVar9 != (char *)0x0) && (0 < (int)uVar1)) {
        lVar20 = 0;
        lVar18 = 0;
        do {
          lVar18 = (long)(int)lVar18;
          lVar11 = lVar18 + -1;
          do {
            lVar12 = lVar11;
            lVar18 = lVar18 + 1;
            bVar5 = local_138[lVar12 + 1];
            lVar11 = lVar12 + 1;
          } while (bVar5 == 0x20);
          uVar22 = 0;
          while ((bVar5 & 0xdf) != 0) {
            lVar11 = uVar22 + lVar12 + 1;
            uVar22 = uVar22 + 1;
            lVar18 = lVar18 + 1;
            bVar5 = local_138[lVar11 + 1];
          }
          if ((int)uVar22 < 1) {
            pcVar9 = "Comment reading file: no numbers on integerColumn row.";
LAB_0015598b:
            puts(pcVar9);
            return 0;
          }
          pcVar9 = (char *)malloc(uVar22 & 0xffffffff);
          memcpy(pcVar9,local_138 + lVar12 + 1,uVar22);
          iVar6 = atoi(pcVar9);
          (*integerColumn)[lVar20] = iVar6;
          lVar20 = lVar20 + 1;
          if ((lVar20 < lVar15) && ((local_138 + lVar12 + 1)[uVar22] == 0)) {
            pcVar9 = "Error reading file: not enough numbers on integerColumn row.";
            goto LAB_001557ab;
          }
        } while (lVar20 != lVar15);
      }
    }
  }
LAB_00155974:
  fclose(__stream);
  return 0;
}

Assistant:

int readToy_MIP_cpp(const char *filename, int* m_p, int* n_p, int* maxmin, double* offset,
		  double ** A,
		  double ** b, double ** c, double ** lb, double ** ub,
		  int** integerColumn) {
  const int buff_ln=255;
  char buff[buff_ln];
  char *fgets_rt;
  int n, m;
  int start, end;
  int rp_rd = 0;
  double rl_v;
  int i_v;
  char *term;
  int i, j, k;
  
#ifdef JAJH_dev
    printf("readMPS: Trying to open file %s\n", filename);
#endif
    FILE *file_p = fopen(filename, "r");
    if (file_p == 0) {
#ifdef JAJH_dev
      printf("readInput: Not opened file OK\n");
#endif
      return 1;
    }
#ifdef JAJH_dev
    printf("readInput: Opened file  OK\n");
#endif
    fgets_rt = fgets(buff, buff_ln, file_p);
    
    sscanf(buff, "%d %d %d", m_p, n_p, maxmin);
    if (rp_rd > 0) printf("Read %d %d %d for m_p, n_p, maxmin\n", *(m_p), *(n_p), *(maxmin));
    n = *(n_p);
    m = *(m_p);
    
    //Allocate arrays
    *c = (double *) malloc(sizeof(double)*n);
    *A = (double *) malloc(sizeof(double)*(m*n));
    *b = (double *) malloc(sizeof(double)*m);
    *lb = (double *) malloc(sizeof(double)*n);
    *ub = (double *) malloc(sizeof(double)*n);
    *integerColumn = (int *) malloc(sizeof(int)*n);

    fgets_rt = fgets(buff, buff_ln, file_p);
    start=0;
    while (buff[start]==' ' &&  buff[start] != '\0') {
      //      printf("buff[%3d] = %s\n", start, buff[start]);
      start++;}
    
    //Read cost and offset
    j = 0;
    start = 0;
    while ( j <= n ) {
      if (rp_rd > 0) printf("\n Col %d\n", j);
      while (buff[start]==' ') 
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;
      
      int len = end - start;
      if (rp_rd > 0) printf("buff: start =%2d, len =%2d, end =%2d\n", start, len, end);
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Error reading file: not enough numbers on row of objective.\n");
	return 1;
      }
      
      rl_v = atof(term);
      if (j < n) {
	(*c)[j] = rl_v;
	if (rp_rd > 0) printf("Read %s giving %g for (*c)[%d]\n", term, rl_v, j);
	j++;
	if (buff[end] == '\0') {
	  printf("Error reading file: not enough numbers on row of objective.\n");
	  return 1;
	}	
	start = end + 1;
      }
      else {
	*offset = rl_v;
	if (rp_rd > 0) printf("Read %s giving %g for offset\n", term, rl_v);
	j++;
      }
    }
    
    //Read matrix and RHS
    i = 0;
    while (i < m) {
      fgets_rt = fgets(buff, buff_ln, file_p);
      
      start=0;
      while (buff[start]==' ' &&  buff[start] != '\0')
	start++;
      
      //JAJH: QY - This doesn't seem to do what was intended
      if (buff[start] == '\0')
	printf("Error reading file: not enough numbers on row %d of A.\n", i);
      
      j = 0;
      while (j < n) {
	while (buff[start]==' ')
	  start++;
	
	end = start;
	while (buff[end]!=' ' && buff[end] != '\0')
	  end++;
	
	int len = end - start;
	
	if (len>0) {
	  term = (char *) malloc(sizeof(char)*len);
	  for (k=0;k<len;k++)
	    term[k] = buff[start+k];
	} else {
	  //JAJH: QY - LEN<=0 means that the end of the line has been reached
	  printf("Error reading file: not enough numbers on row for RHS.\n");
	  return 1;
	}
	
	rl_v = atof(term);
	
	//Row-wise
	//	int ind = (i * n) + j;
	//Column-wise
	int ind = (j * m) + i;
	(*A)[ind] = rl_v;
	if (rp_rd > 0) printf("Read %s giving %g for (*A)[%d]\n", term, rl_v, ind);
	j++;
	if (buff[end] == '\0') {
	  printf("Error reading file: not enough numbers on constraint row.\n");
	  return 1;
	}	
	start = end + 1;
      }
      
      //RHS
      while (buff[start]==' ')
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;
      
      int len = end - start;
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Error reading file: not enough numbers on constraint row.\n");
	return 1;
      }
      
      rl_v = atof(term);
      (*b)[i] = rl_v;
      if (rp_rd > 0) printf("Read %s giving %g for (*b)[%d]\n", term, rl_v, i);
      i++;
    }
    //Set up default values of lower bounds, upper bounds and integer information
    for (int c_n = 0; c_n < n; c_n++) {
      (*lb)[c_n] = 0;
      (*ub)[c_n] = HSOL_CONST_INF;
      (*integerColumn)[c_n] = 0;
    }

    //Read lower bounds on columns
    fgets_rt = fgets(buff, buff_ln, file_p);
    if (rp_rd > 0) printf("LB: fgets return value = %s\n", fgets_rt);
    if (fgets_rt == NULL) {
      fclose(file_p);
      return 0;
    }
    start=0;
    while (buff[start]==' ' &&  buff[start] != '\0') {
      //      printf("buff[%3d] = %s\n", start, buff[start]);
      start++;}
    
    j = 0;
    start = 0;
    while ( j < n ) {
      if (rp_rd > 0) printf("\n Col %d\n", j);
      while (buff[start]==' ') 
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;

      int len = end - start;
      if (rp_rd > 0) printf("buff: start =%2d, len =%2d, end =%2d\n", start, len, end);
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Comment reading file: no numbers on LB row.\n");
	return 0;
      }
      
      rl_v = atof(term);
      (*lb)[j] = rl_v;
      if (rp_rd > 0) printf("Read %s giving %g for (*lb)[%d]\n", term, rl_v, j);
      j++;
      if (j<n && buff[end] == '\0') {
	printf("Error reading file: not enough numbers on LB row.\n");
	return 1;
      }
      start = end + 1;
    }
    
    //Read upper bounds on columns
    fgets_rt = fgets(buff, buff_ln, file_p);
    if (rp_rd > 0) printf("UB: fgets return value = %s\n", fgets_rt);
    if (fgets_rt == NULL) {
      fclose(file_p);
      return 0;
    }
    start=0;
    while (buff[start]==' ' &&  buff[start] != '\0') {
      //      printf("buff[%3d] = %s\n", start, buff[start]);
      start++;}
    
    j = 0;
    start = 0;
    while ( j < n ) {
      if (rp_rd > 0) printf("\n Col %d\n", j);
      while (buff[start]==' ') 
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;
      
      int len = end - start;
      if (rp_rd > 0) printf("buff: start =%2d, len =%2d, end =%2d\n", start, len, end);
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Comment reading file: no numbers on UB row.\n");
	return 0;
      }
      
      rl_v = atof(term);
      (*ub)[j] = rl_v;
      if (rp_rd > 0) printf("Read %s giving %g for (*ub)[%d]\n", term, rl_v, j);
      j++;
      if (j<n && buff[end] == '\0') {
	printf("Error reading file: not enough numbers on UB row.\n");
	return 1;
      }
      start = end + 1;
    }

    //Read integer information for columns
    fgets_rt = fgets(buff, buff_ln, file_p);
    if (rp_rd > 0) printf("IC: fgets return value = %s\n", fgets_rt);
    if (fgets_rt == NULL) {
      fclose(file_p);
      return 0;
    }
    start=0;
    while (buff[start]==' ' &&  buff[start] != '\0') {
      //      printf("buff[%3d] = %s\n", start, buff[start]);
      start++;}
    
    j = 0;
    start = 0;
    while ( j < n ) {
      if (rp_rd > 0) printf("\n Col %d\n", j);
      while (buff[start]==' ') 
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;
      
      int len = end - start;
      if (rp_rd > 0) printf("buff: start =%2d, len =%2d, end =%2d\n", start, len, end);
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Comment reading file: no numbers on integerColumn row.\n");
	return 0;
      }
      
      i_v = atoi(term);
      (*integerColumn)[j] = i_v;
      if (rp_rd > 0) printf("Read %s giving %d for (*integerColumn)[%d]\n", term, i_v, j);
      j++;
      if (j<n && buff[end] == '\0') {
	printf("Error reading file: not enough numbers on integerColumn row.\n");
	return 1;
      }
      start = end + 1;
    }
    fclose(file_p);
    return 0;
}